

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

bool __thiscall BasicBlock::Contains(BasicBlock *this,Instr *instr)

{
  BasicBlock *pBVar1;
  Instr *pIVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  long lVar6;
  Func **ppFVar7;
  Instr *pIVar8;
  Instr *pIVar9;
  Instr **ppIVar10;
  
  pBVar1 = this->next;
  ppFVar7 = (Func **)&pBVar1->firstInstr;
  if (pBVar1 == (BasicBlock *)0x0) {
    ppFVar7 = &this->func;
  }
  lVar6 = 0x18;
  if (pBVar1 == (BasicBlock *)0x0) {
    lVar6 = 0xd0;
  }
  lVar6 = *(long *)((long)&(*ppFVar7)->m_alloc + lVar6);
  if (lVar6 == 0) {
    pIVar9 = (Instr *)0x0;
  }
  else {
    pIVar9 = *(Instr **)(lVar6 + 0x10);
  }
  ppIVar10 = &this->firstInstr;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  pIVar8 = (Instr *)0x0;
  do {
    pIVar2 = *ppIVar10;
    if (pIVar2 == pIVar9) break;
    if ((pIVar8 != (Instr *)0x0) && (pIVar8->m_next != pIVar2)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xe7c,
                         "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == blockInstr)",
                         "Modifying instr list but not using EDITING iterator!");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    ppIVar10 = &pIVar2->m_next;
    pIVar8 = pIVar2;
  } while (pIVar2 != instr);
  return pIVar2 != pIVar9;
}

Assistant:

FOREACH_INSTR_IN_BLOCK(blockInstr, this)
    {
        if (instr == blockInstr)
        {
            return true;
        }
    }